

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

bool __thiscall CDBWrapper::ExistsImpl(CDBWrapper *this,Span<const_std::byte> key)

{
  long lVar1;
  DB *pDVar2;
  LevelDBContext *pLVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Status status;
  Slice slKey;
  string local_58;
  string strValue;
  
  slKey.size_ = key.m_size;
  slKey.data_ = (char *)key.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strValue._M_dataplus._M_p = (pointer)&strValue.field_2;
  strValue._M_string_length = 0;
  strValue.field_2._M_local_buf[0] = '\0';
  pLVar3 = DBContext(this);
  pDVar2 = pLVar3->pdb;
  pLVar3 = DBContext(this);
  (*pDVar2->_vptr_DB[5])(&status,pDVar2,&pLVar3->readoptions,&slKey,&strValue);
  bVar4 = true;
  if (status.state_ != (char *)0x0) {
    if (status.state_[4] == '\x01') {
      bVar4 = false;
    }
    else {
      leveldb::Status::ToString_abi_cxx11_(&local_58,&status);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      logging_function._M_str = "ExistsImpl";
      logging_function._M_len = 10;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x169,
                 IPC|I2P|QT|LIBEVENT|RAND|REINDEX|SELECTCOINS|RPC|ZMQ|TOR,(Level)&local_58,
                 status.state_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)slKey.data_);
      std::__cxx11::string::~string((string *)&local_58);
      HandleError(&status);
    }
  }
  leveldb::Status::~Status(&status);
  std::__cxx11::string::~string((string *)&strValue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::ExistsImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());

    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return false;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return true;
}